

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_item_checks.hpp
# Opt level: O3

void PatchFixItemChecks::fix_dog_talking_check(ROM *rom)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint32_t address;
  pointer puVar5;
  pointer puVar6;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dog_cutscenes;
  Code cutscene;
  allocator_type local_d9;
  ROM *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  Code local_a8;
  
  md::ROM::set_word(rom,0x253c0,0x281);
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2647e00026238;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x272b400026a40;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0,__l,&local_d9);
  local_d0 = local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar6 = local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8 = rom;
    do {
      address = *puVar6;
      puVar5 = (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = puVar5[address + 6];
      uVar2 = puVar5[address + 7];
      uVar3 = puVar5[address + 10];
      uVar4 = puVar5[address + 0xb];
      local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c8 = puVar6;
      local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      md::Code::add_word(&local_a8,0x6100);
      md::Code::add_word(&local_a8,0x5d94 - (short)address);
      md::Code::add_word(&local_a8,0x281);
      md::Code::add_word(&local_a8,CONCAT11(uVar3,uVar4));
      md::Code::add_word(&local_a8,CONCAT11(uVar1,uVar2));
      md::Code::rts(&local_a8);
      rom = local_d8;
      md::ROM::set_code(local_d8,address,&local_a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree(&local_a8._labels._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_a8._pending_branches._M_t);
      if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8._bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8._bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar6 = local_c8 + 1;
    } while (puVar6 != local_d0);
  }
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void fix_dog_talking_check(md::ROM& rom)
    {
        // Massan dog
        // 0x0253C0:
        // Before:	01 24 (0124 >> 3 = 24 and 0124 & 7 = 04 -----> bit 4 of FF1024)
        // After:	02 81 (0281 >> 3 = 50 and 0281 & 7 = 01 -----> bit 1 of FF1050)
        rom.set_word(0x0253C0, 0x0281);

        // Other dogs
        std::vector<uint32_t> dog_cutscenes = { 0x26238, 0x2647E, 0x26A40, 0x272B4 };
        for(uint32_t addr : dog_cutscenes)
        {
            uint32_t dialogue_without_whistle_offset = rom.get_word(addr + 6);
            uint32_t dialogue_with_whistle_offset = rom.get_word(addr + 10);

            md::Code cutscene;
            {
                uint32_t offset = 0x25D96 - (addr + 2); // 0x25D96 = CheckFlagAndDisplayMessage
                cutscene.add_word(0x6100);
                cutscene.add_word((uint16_t) offset);

                cutscene.add_word(0x0281); // 0281 (0281 >> 3 = 50 and 0281 & 7 = 01 -----> bit 1 of FF1050)

                cutscene.add_word(dialogue_with_whistle_offset);
                cutscene.add_word(dialogue_without_whistle_offset);

                cutscene.rts();
            }

            rom.set_code(addr, cutscene);
        }
    }